

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.h
# Opt level: O0

void __thiscall
slang::ast::Delay3Control::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (Delay3Control *this,MonitorVisitor *visitor)

{
  Expression *in_RSI;
  MonitorVisitor *in_RDI;
  
  Expression::visit<slang::ast::builtins::MonitorVisitor&>(in_RSI,in_RDI);
  if (in_RDI[5].context != (ASTContext *)0x0) {
    Expression::visit<slang::ast::builtins::MonitorVisitor&>(in_RSI,in_RDI);
  }
  if (in_RDI[6].context != (ASTContext *)0x0) {
    Expression::visit<slang::ast::builtins::MonitorVisitor&>(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr1.visit(visitor);
        if (expr2)
            expr2->visit(visitor);
        if (expr3)
            expr3->visit(visitor);
    }